

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_function_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::ParseFunctionGenerator::ParseFunctionGenerator
          (ParseFunctionGenerator *this,Descriptor *descriptor,int max_has_bit_index,
          Span<const_int> has_bit_indices,Span<const_int> inlined_string_indices,Options *options,
          MessageSCCAnalyzer *scc_analyzer,
          flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages)

{
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  unique_ptr<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  *this_01;
  pointer ppFVar1;
  _Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false> __ptr;
  Span<const_int> inlined_string_indices_00;
  pointer __p;
  _Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false> _Var2;
  Descriptor *descriptor_00;
  MessageSCCAnalyzer *scc_analyzer_00;
  Span<const_google::protobuf::internal::TailCallTableInfo::FieldOptions> field_options;
  Span<const_google::protobuf::FieldDescriptor_*const> ordered_fields;
  vector<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
  local_120;
  undefined1 local_108 [32];
  pointer local_e8;
  pointer pFStack_e0;
  pointer local_d8;
  pointer local_d0;
  pointer pAStack_c8;
  pointer local_c0;
  uint32_t local_b8;
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  local_b0;
  pointer local_98;
  pointer puStack_90;
  pointer local_88;
  int local_80;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>::iterator,_bool>
  local_68;
  pointer local_50;
  Descriptor *pDStack_48;
  pointer local_40;
  size_type sStack_38;
  
  this->descriptor_ = descriptor;
  this->scc_analyzer_ = scc_analyzer;
  this->options_ = options;
  this_00 = &this->variables_;
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)this_00,
                 (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)vars,(allocator_type *)local_108);
  this_01 = &this->tc_table_info_;
  (this->tc_table_info_)._M_t.
  super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>._M_head_impl =
       (TailCallTableInfo *)0x0;
  local_70 = &this->inlined_string_indices_;
  std::vector<int,std::allocator<int>>::vector<int_const*,void>
            ((vector<int,std::allocator<int>> *)local_70,inlined_string_indices.ptr_,
             inlined_string_indices.ptr_ + inlined_string_indices.len_,(allocator_type *)local_108);
  local_78 = &this->ordered_fields_;
  GetOrderedFields(local_78,this->descriptor_);
  this->num_hasbits_ = max_has_bit_index;
  this->index_in_file_messages_ = index_in_file_messages;
  ppFVar1 = (this->ordered_fields_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ordered_fields.len_ =
       (long)(this->ordered_fields_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3;
  scc_analyzer_00 = this->scc_analyzer_;
  local_50 = (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  pDStack_48 = (Descriptor *)
               ((long)(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)local_50 >> 2);
  inlined_string_indices_00.len_ = (size_type)pDStack_48;
  inlined_string_indices_00.ptr_ = local_50;
  ordered_fields.ptr_ = ppFVar1;
  local_40 = has_bit_indices.ptr_;
  sStack_38 = has_bit_indices.len_;
  BuildFieldOptions(&local_120,pDStack_48,ordered_fields,this->options_,scc_analyzer_00,
                    has_bit_indices,inlined_string_indices_00);
  field_options.ptr_ =
       (pointer)((long)local_120.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_120.
                       super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5);
  field_options.len_ = (size_type)scc_analyzer_00;
  BuildTcTableInfoFromDescriptor
            ((TailCallTableInfo *)local_108,(ParseFunctionGenerator *)this->descriptor_,
             (Descriptor *)this->options_,
             (Options *)
             local_120.
             super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
             ._M_impl.super__Vector_impl_data._M_start,field_options);
  _Var2._M_head_impl = (TailCallTableInfo *)operator_new(0x90);
  (_Var2._M_head_impl)->fallback_function = (TcParseFunction)local_108[0];
  *(undefined8 *)
   &((_Var2._M_head_impl)->fast_path_fields).
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FastFieldInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FastFieldInfo>_>
       = local_108._8_8_;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->fast_path_fields + 8) = local_108._16_8_;
  *(undefined8 *)((long)&(_Var2._M_head_impl)->fast_path_fields + 0x10) = local_108._24_8_;
  local_108._24_8_ = (pointer)0x0;
  local_108._8_8_ = (pointer)0x0;
  local_108._16_8_ = (pointer)0x0;
  *(pointer *)
   &((_Var2._M_head_impl)->field_entries).
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldEntryInfo>_>
       = local_e8;
  *(pointer *)((long)&(_Var2._M_head_impl)->field_entries + 8) = pFStack_e0;
  *(pointer *)((long)&(_Var2._M_head_impl)->field_entries + 0x10) = local_d8;
  local_d8 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  pFStack_e0 = (pointer)0x0;
  *(pointer *)
   &((_Var2._M_head_impl)->aux_entries).
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::AuxEntry,_std::allocator<google::protobuf::internal::TailCallTableInfo::AuxEntry>_>
       = local_d0;
  *(pointer *)((long)&(_Var2._M_head_impl)->aux_entries + 8) = pAStack_c8;
  *(pointer *)((long)&(_Var2._M_head_impl)->aux_entries + 0x10) = local_c0;
  local_c0 = (pointer)0x0;
  local_d0 = (pointer)0x0;
  pAStack_c8 = (pointer)0x0;
  ((_Var2._M_head_impl)->num_to_entry_table).skipmap32 = local_b8;
  *(pointer *)
   &((vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
      *)((long)&(_Var2._M_head_impl)->num_to_entry_table + 8))->
    super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       = local_b0.
         super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
         ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)((long)&(_Var2._M_head_impl)->num_to_entry_table + 0x10) =
       local_b0.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)((long)&(_Var2._M_head_impl)->num_to_entry_table + 0x18) =
       local_b0.
       super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_b0.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b0.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b0.
  super__Vector_base<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(pointer *)
   &((_Var2._M_head_impl)->field_name_data).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> = local_98;
  *(pointer *)((long)&(_Var2._M_head_impl)->field_name_data + 8) = puStack_90;
  *(pointer *)((long)&(_Var2._M_head_impl)->field_name_data + 0x10) = local_88;
  local_88 = (pointer)0x0;
  local_98 = (pointer)0x0;
  puStack_90 = (pointer)0x0;
  (_Var2._M_head_impl)->table_size_log2 = local_80;
  local_68.first.ctrl_ = (ctrl_t *)0x0;
  __ptr._M_head_impl =
       (this_01->_M_t).
       super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
       ._M_t.
       super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
       .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>._M_head_impl;
  (this_01->_M_t).
  super___uniq_ptr_impl<google::protobuf::internal::TailCallTableInfo,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::internal::TailCallTableInfo_*,_std::default_delete<google::protobuf::internal::TailCallTableInfo>_>
  .super__Head_base<0UL,_google::protobuf::internal::TailCallTableInfo_*,_false>._M_head_impl =
       _Var2._M_head_impl;
  if (__ptr._M_head_impl != (TailCallTableInfo *)0x0) {
    std::default_delete<google::protobuf::internal::TailCallTableInfo>::operator()
              ((default_delete<google::protobuf::internal::TailCallTableInfo> *)this_01,
               __ptr._M_head_impl);
    if ((TailCallTableInfo *)local_68.first.ctrl_ != (TailCallTableInfo *)0x0) {
      std::default_delete<google::protobuf::internal::TailCallTableInfo>::operator()
                ((default_delete<google::protobuf::internal::TailCallTableInfo> *)&local_68,
                 (TailCallTableInfo *)local_68.first.ctrl_);
    }
  }
  local_68.first.ctrl_ = (ctrl_t *)0x0;
  if (local_98 != (pointer)0x0) {
    operator_delete(local_98,(long)local_88 - (long)local_98);
  }
  std::
  vector<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock,_std::allocator<google::protobuf::internal::TailCallTableInfo::SkipEntryBlock>_>
  ::~vector(&local_b0);
  if (local_d0 != (pointer)0x0) {
    operator_delete(local_d0,(long)local_c0 - (long)local_d0);
  }
  if (local_e8 != (pointer)0x0) {
    operator_delete(local_e8,(long)local_d8 - (long)local_e8);
  }
  if ((pointer)local_108._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_108._8_8_,local_108._24_8_ - local_108._8_8_);
  }
  SetCommonMessageDataVariables(this->descriptor_,this_00);
  SetUnknownFieldsVariable(this->descriptor_,this->options_,this_00);
  ClassName_abi_cxx11_((string *)local_108,(cpp *)descriptor,descriptor_00);
  absl::lts_20250127::container_internal::
  raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::try_emplace_impl<char_const(&)[10]>(&local_68,this_00,(char (*) [10])0x549f88);
  std::__cxx11::string::operator=
            ((string *)((long)local_68.first.field_1.slot_ + 0x10),(string *)local_108);
  if ((undefined1 *)CONCAT71(local_108._1_7_,local_108[0]) != local_108 + 0x10) {
    operator_delete((undefined1 *)CONCAT71(local_108._1_7_,local_108[0]),
                    (ulong)(local_108._16_8_ + 1));
  }
  if ((Options *)
      local_120.
      super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
      ._M_impl.super__Vector_impl_data._M_start != (Options *)0x0) {
    operator_delete(local_120.
                    super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.
                          super__Vector_base<google::protobuf::internal::TailCallTableInfo::FieldOptions,_std::allocator<google::protobuf::internal::TailCallTableInfo::FieldOptions>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

ParseFunctionGenerator::ParseFunctionGenerator(
    const Descriptor* descriptor, int max_has_bit_index,
    absl::Span<const int> has_bit_indices,
    absl::Span<const int> inlined_string_indices, const Options& options,
    MessageSCCAnalyzer* scc_analyzer,
    const absl::flat_hash_map<absl::string_view, std::string>& vars,
    int index_in_file_messages)
    : descriptor_(descriptor),
      scc_analyzer_(scc_analyzer),
      options_(options),
      variables_(vars),
      // Copy the absl::Span into a vector owned by the class.
      inlined_string_indices_(inlined_string_indices.begin(),
                              inlined_string_indices.end()),
      ordered_fields_(GetOrderedFields(descriptor_)),
      num_hasbits_(max_has_bit_index),
      index_in_file_messages_(index_in_file_messages) {
  auto fields =
      BuildFieldOptions(descriptor_, ordered_fields_, options_, scc_analyzer_,
                        has_bit_indices, inlined_string_indices_);
  tc_table_info_ = std::make_unique<TailCallTableInfo>(
      BuildTcTableInfoFromDescriptor(descriptor_, options_, fields));
  SetCommonMessageDataVariables(descriptor_, &variables_);
  SetUnknownFieldsVariable(descriptor_, options_, &variables_);
  variables_["classname"] = ClassName(descriptor, false);
}